

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O3

void tcu::astc::decompress
               (PixelBufferAccess *dst,deUint8 *data,CompressedTexFormat format,AstcMode mode)

{
  uint blockWidth;
  int blockHeight;
  bool bVar1;
  bool isSRGB;
  long lVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  byte *pbVar6;
  ulong uVar7;
  int iVar8;
  Block128 blockData;
  anon_union_2304_2_1776bc36 decompressedBuffer;
  int local_95c;
  Vec4 local_950;
  Block128 local_940;
  float local_930 [576];
  
  isSRGB = isAstcSRGBFormat(format);
  blockWidth = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
  blockHeight = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    pbVar6 = data + lVar5;
    lVar2 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 | (ulong)*pbVar6 << ((byte)lVar2 & 0x3f);
      lVar2 = lVar2 + 8;
      pbVar6 = pbVar6 + 1;
    } while (lVar2 != 0x40);
    *(ulong *)((long)local_940.m_words + lVar5) = uVar7;
    lVar5 = 8;
    bVar1 = false;
  } while (bVar3);
  anon_unknown_0::decompressBlock
            (local_930,&local_940,blockWidth,blockHeight,isSRGB,mode == ASTCMODE_LDR || isSRGB);
  if (isSRGB) {
    if (0 < blockHeight) {
      iVar8 = 0;
      local_95c = 3;
      do {
        if (0 < (int)blockWidth) {
          uVar7 = 0;
          iVar4 = local_95c;
          do {
            local_950.m_data[0] = (float)(uint)*(byte *)((long)local_930 + (long)(iVar4 + -3));
            local_950.m_data[1] = (float)(uint)*(byte *)((long)local_930 + (long)(iVar4 + -2));
            local_950.m_data[2] = (float)(uint)*(byte *)((long)local_930 + (long)(iVar4 + -1));
            local_950.m_data[3] = (float)(uint)*(byte *)((long)local_930 + (long)iVar4);
            PixelBufferAccess::setPixel(dst,(IVec4 *)&local_950,(int)uVar7,iVar8,0);
            uVar7 = uVar7 + 1;
            iVar4 = iVar4 + 4;
          } while (blockWidth != uVar7);
        }
        iVar8 = iVar8 + 1;
        local_95c = local_95c + blockWidth * 4;
      } while (iVar8 != blockHeight);
    }
  }
  else if (0 < blockHeight) {
    iVar8 = 0;
    local_95c = 3;
    do {
      if (0 < (int)blockWidth) {
        uVar7 = 0;
        iVar4 = local_95c;
        do {
          local_950.m_data[0] = local_930[iVar4 + -3];
          local_950.m_data[1] = local_930[iVar4 + -2];
          local_950.m_data[2] = local_930[iVar4 + -1];
          local_950.m_data[3] = local_930[iVar4];
          PixelBufferAccess::setPixel(dst,&local_950,(int)uVar7,iVar8,0);
          uVar7 = uVar7 + 1;
          iVar4 = iVar4 + 4;
        } while (blockWidth != uVar7);
      }
      iVar8 = iVar8 + 1;
      local_95c = local_95c + blockWidth * 4;
    } while (iVar8 != blockHeight);
  }
  return;
}

Assistant:

void decompress (const PixelBufferAccess& dst, const deUint8* data, CompressedTexFormat format, TexDecompressionParams::AstcMode mode)
{
	const bool			isSRGBFormat	= isAstcSRGBFormat(format);

#if defined(DE_DEBUG)
	const tcu::IVec3	blockPixelSize	= getBlockPixelSize(format);

	DE_ASSERT(dst.getWidth()	== blockPixelSize.x() &&
			  dst.getHeight()	== blockPixelSize.y() &&
			  dst.getDepth()	== blockPixelSize.z());
	DE_ASSERT(mode == TexDecompressionParams::ASTCMODE_LDR || mode == TexDecompressionParams::ASTCMODE_HDR);
#endif

	// sRGB is not supported in HDR mode
	DE_ASSERT(!(mode == TexDecompressionParams::ASTCMODE_HDR && isSRGBFormat));

	decompress(dst, data, isSRGBFormat, isSRGBFormat || mode == TexDecompressionParams::ASTCMODE_LDR);
}